

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O2

void __thiscall cmInstallScriptGenerator::GenerateScript(cmInstallScriptGenerator *this,ostream *os)

{
  ostream *poVar1;
  char *pcVar2;
  string component_test;
  
  cmInstallGenerator::CreateComponentTest_abi_cxx11_
            (&component_test,&this->super_cmInstallGenerator,
             (this->super_cmInstallGenerator).Component._M_dataplus._M_p,
             (this->super_cmInstallGenerator).ExcludeFromAll);
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x0);
  poVar1 = std::operator<<(poVar1,"if(");
  poVar1 = std::operator<<(poVar1,(string *)&component_test);
  std::operator<<(poVar1,")\n");
  if (this->Code == true) {
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x2);
    poVar1 = std::operator<<(poVar1,(string *)&this->Script);
    pcVar2 = "\n";
  }
  else {
    poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x2);
    poVar1 = std::operator<<(poVar1,"include(\"");
    poVar1 = std::operator<<(poVar1,(string *)&this->Script);
    pcVar2 = "\")\n";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = operator<<(os,(cmScriptGeneratorIndent)0x0);
  std::operator<<(poVar1,"endif()\n\n");
  std::__cxx11::string::~string((string *)&component_test);
  return;
}

Assistant:

void cmInstallScriptGenerator::GenerateScript(std::ostream& os)
{
  Indent indent;
  std::string component_test =
    this->CreateComponentTest(this->Component.c_str(), this->ExcludeFromAll);
  os << indent << "if(" << component_test << ")\n";

  if (this->Code) {
    os << indent.Next() << this->Script << "\n";
  } else {
    os << indent.Next() << "include(\"" << this->Script << "\")\n";
  }

  os << indent << "endif()\n\n";
}